

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferSubDataUploadCase::testBufferUpload
          (BufferSubDataUploadCase *this,
          UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *result,int bufferSize)

{
  int iVar1;
  undefined4 extraout_var;
  deUint64 dVar3;
  deUint64 dVar4;
  long lVar5;
  long lVar2;
  
  iVar1 = (*((this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             .super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar2 + 0x40))
            (0x8892,(this->
                    super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    ).
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    .m_bufferID);
  if (this->m_invalidateBeforeUse == true) {
    (**(code **)(lVar2 + 0x150))
              (0x8892,(long)bufferSize,0,
               (this->
               super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               ).m_bufferUsage);
  }
  dVar3 = deGetMicroseconds();
  if (this->m_fullUpload == false) {
    lVar5 = (long)(bufferSize / 4);
    iVar1 = bufferSize / 2;
  }
  else {
    lVar5 = 0;
    iVar1 = bufferSize;
  }
  (**(code **)(lVar2 + 0x168))
            (0x8892,lVar5,(long)iVar1,
             (this->
             super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_zeroData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar4 = deGetMicroseconds();
  (result->duration).totalDuration = dVar4 - dVar3;
  (result->duration).fitResponseDuration = dVar4 - dVar3;
  iVar1 = bufferSize / 2;
  if (this->m_fullUpload != false) {
    iVar1 = bufferSize;
  }
  result->writtenSize = iVar1;
  return;
}

Assistant:

void BufferSubDataUploadCase::testBufferUpload (UploadSampleResult<SingleOperationDuration>& result, int bufferSize)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bufferID);

	// "invalidate", upload null
	if (m_invalidateBeforeUse)
		gl.bufferData(GL_ARRAY_BUFFER, bufferSize, DE_NULL, m_bufferUsage);

	// upload
	{
		deUint64 startTime;
		deUint64 endTime;

		startTime = deGetMicroseconds();

		if (m_fullUpload)
			gl.bufferSubData(GL_ARRAY_BUFFER, 0, bufferSize, &m_zeroData[0]);
		else
		{
			// upload to buffer center
			gl.bufferSubData(GL_ARRAY_BUFFER, bufferSize / 4, bufferSize / 2, &m_zeroData[0]);
		}

		endTime = deGetMicroseconds();

		result.duration.totalDuration = endTime - startTime;
		result.duration.fitResponseDuration = result.duration.totalDuration;

		if (m_fullUpload)
			result.writtenSize = bufferSize;
		else
			result.writtenSize = bufferSize / 2;
	}
}